

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QObject_*(*)()>::begin(QList<QObject_*(*)()> *this)

{
  _func_QObject_ptr **n;
  QArrayDataPointer<QObject_*(*)()> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QObject_*(*)()> *)0x4494b9);
  QArrayDataPointer<QObject_*(*)()>::operator->(in_RDI);
  n = QArrayDataPointer<QObject_*(*)()>::begin((QArrayDataPointer<QObject_*(*)()> *)0x4494ca);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }